

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::update(Texture *this,Texture *texture,uint x,uint y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  GLenum GVar4;
  GLenum GVar5;
  ostream *poVar6;
  Uint64 UVar7;
  uint uVar8;
  TransientContextLock lock_1;
  GLuint destFrameBuffer;
  TextureSaver save;
  GLuint sourceFrameBuffer;
  GLint drawFramebuffer;
  TransientContextLock lock;
  
  if ((this->m_texture != 0) && (texture->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::ensureExtensionsInit();
    GlResource::TransientContextLock::~TransientContextLock(&lock);
    if ((SF_GLAD_GL_EXT_framebuffer_object == 0) || (SF_GLAD_GL_EXT_framebuffer_blit == 0)) {
      copyToImage((Image *)&lock,texture);
      update(this,(Image *)&lock,x,y);
      Image::~Image((Image *)&lock);
    }
    else {
      GlResource::TransientContextLock::TransientContextLock(&lock_1);
      _lock = 0;
      drawFramebuffer = 0;
      (*sf_glad_glGetIntegerv)(0x8caa,(GLint *)&lock);
      (*sf_glad_glGetIntegerv)(0x8ca6,&drawFramebuffer);
      sourceFrameBuffer = 0;
      destFrameBuffer = 0;
      (*sf_glad_glGenFramebuffersEXT)(1,&sourceFrameBuffer);
      (*sf_glad_glGenFramebuffersEXT)(1,&destFrameBuffer);
      if ((sourceFrameBuffer == 0) || (destFrameBuffer == 0)) {
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,
                                 "Cannot copy texture, failed to create a frame buffer object");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,sourceFrameBuffer);
        (*sf_glad_glFramebufferTexture2DEXT)(0x8ca8,0x8ce0,0xde1,texture->m_texture,0);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,destFrameBuffer);
        (*sf_glad_glFramebufferTexture2DEXT)(0x8ca9,0x8ce0,0xde1,this->m_texture,0);
        GVar4 = (*sf_glad_glCheckFramebufferStatusEXT)(0x8ca8);
        GVar5 = (*sf_glad_glCheckFramebufferStatusEXT)(0x8ca9);
        if ((GVar4 == 0x8cd5) && (GVar5 == 0x8cd5)) {
          uVar1 = (texture->m_size).x;
          uVar2 = (texture->m_size).y;
          uVar8 = uVar2;
          uVar3 = 0;
          if (texture->m_pixelsFlipped != false) {
            uVar8 = 0;
            uVar3 = uVar2;
          }
          (*sf_glad_glBlitFramebufferEXT)(0,uVar3,uVar1,uVar8,x,y,uVar1 + x,uVar2 + y,0x4000,0x2600)
          ;
        }
        else {
          poVar6 = err();
          poVar6 = std::operator<<(poVar6,
                                   "Cannot copy texture, failed to link texture to frame buffer");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,_lock);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,drawFramebuffer);
        (*sf_glad_glDeleteFramebuffersEXT)(1,&sourceFrameBuffer);
        (*sf_glad_glDeleteFramebuffersEXT)(1,&destFrameBuffer);
        priv::TextureSaver::TextureSaver(&save);
        (*sf_glad_glBindTexture)(0xde1,this->m_texture);
        (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
        this->m_hasMipmap = false;
        this->m_pixelsFlipped = false;
        UVar7 = anon_unknown.dwarf_206646::TextureImpl::getUniqueId();
        this->m_cacheId = UVar7;
        (*sf_glad_glFlush)();
        priv::TextureSaver::~TextureSaver(&save);
      }
      GlResource::TransientContextLock::~TransientContextLock(&lock_1);
    }
  }
  return;
}

Assistant:

void Texture::update(const Texture& texture, unsigned int x, unsigned int y)
{
    assert(x + texture.m_size.x <= m_size.x);
    assert(y + texture.m_size.y <= m_size.y);

    if (!m_texture || !texture.m_texture)
        return;

#ifndef SFML_OPENGL_ES

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();
    }

    if (GLEXT_framebuffer_object && GLEXT_framebuffer_blit)
    {
        TransientContextLock lock;

        // Save the current bindings so we can restore them after we are done
        GLint readFramebuffer = 0;
        GLint drawFramebuffer = 0;

        glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
        glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

        // Create the framebuffers
        GLuint sourceFrameBuffer = 0;
        GLuint destFrameBuffer = 0;
        glCheck(GLEXT_glGenFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glGenFramebuffers(1, &destFrameBuffer));

        if (!sourceFrameBuffer || !destFrameBuffer)
        {
            err() << "Cannot copy texture, failed to create a frame buffer object" << std::endl;
            return;
        }

        // Link the source texture to the source frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, sourceFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_READ_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture.m_texture, 0));

        // Link the destination texture to the destination frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, destFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_DRAW_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));

        // A final check, just to be sure...
        GLenum sourceStatus;
        glCheck(sourceStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_READ_FRAMEBUFFER));

        GLenum destStatus;
        glCheck(destStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_DRAW_FRAMEBUFFER));

        if ((sourceStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE) && (destStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE))
        {
            // Blit the texture contents from the source to the destination texture
            glCheck(GLEXT_glBlitFramebuffer(
                0, texture.m_pixelsFlipped ? static_cast<GLint>(texture.m_size.y) : 0, static_cast<GLint>(texture.m_size.x), texture.m_pixelsFlipped ? 0 : static_cast<GLint>(texture.m_size.y), // Source rectangle, flip y if source is flipped
                static_cast<GLint>(x), static_cast<GLint>(y), static_cast<GLint>(x + texture.m_size.x), static_cast<GLint>(y + texture.m_size.y), // Destination rectangle
                GL_COLOR_BUFFER_BIT, GL_NEAREST
            ));
        }
        else
        {
            err() << "Cannot copy texture, failed to link texture to frame buffer" << std::endl;
        }

        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, static_cast<GLuint>(readFramebuffer)));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, static_cast<GLuint>(drawFramebuffer)));

        // Delete the framebuffers
        glCheck(GLEXT_glDeleteFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glDeleteFramebuffers(1, &destFrameBuffer));

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Set the parameters of this texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = TextureImpl::getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());

        return;
    }

#endif // SFML_OPENGL_ES

    update(texture.copyToImage(), x, y);
}